

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_std.cc
# Opt level: O0

int main(void)

{
  initializer_list<Person> iVar1;
  bool bVar2;
  reference pPVar3;
  ostream *poVar4;
  iterator iVar5;
  Person *local_200;
  Person *p;
  iterator __end1;
  iterator __begin1;
  flat_hash_set<Person,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
  *__range1;
  allocator local_148;
  allocator local_147;
  undefined1 local_146;
  allocator local_145 [20];
  allocator local_131;
  Person *local_130;
  Person local_128;
  string local_e0 [32];
  string asStack_c0 [32];
  undefined4 local_a0;
  string local_98 [32];
  string asStack_78 [32];
  undefined4 local_58;
  iterator local_50;
  size_type local_48;
  undefined1 local_40 [8];
  flat_hash_set<Person,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
  persons;
  
  persons.
  super_raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
  .settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._4_4_ = 0;
  __range1._3_1_ = 1;
  local_130 = &local_128;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"John",&local_131);
  local_146 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128._last,"Mitchell",local_145);
  local_128._age = 0x23;
  local_146 = 0;
  local_130 = (Person *)local_e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"Jane",&local_147);
  __range1._7_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_c0,"Smith",&local_148);
  local_a0 = 0x20;
  __range1._7_1_ = 0;
  local_130 = (Person *)local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"Jane",(allocator *)((long)&__range1 + 6));
  __range1._4_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_78,"Smith",(allocator *)((long)&__range1 + 5));
  local_58 = 0x1e;
  __range1._4_1_ = 0;
  __range1._3_1_ = 0;
  local_50 = &local_128;
  local_48 = 3;
  std::allocator<Person>::allocator((allocator<Person> *)&__range1);
  iVar1._M_len = local_48;
  iVar1._M_array = local_50;
  phmap::flat_hash_set<Person,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
  ::raw_hash_set((flat_hash_set<Person,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
                  *)local_40,iVar1,0,(hasher *)((long)&__range1 + 2),
                 (key_equal *)((long)&__range1 + 1),(allocator<Person> *)&__range1);
  std::allocator<Person>::~allocator((allocator<Person> *)&__range1);
  local_200 = (Person *)&local_50;
  do {
    local_200 = local_200 + -1;
    Person::~Person(local_200);
  } while (local_200 != &local_128);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 6));
  std::allocator<char>::~allocator((allocator<char> *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_147);
  std::allocator<char>::~allocator((allocator<char> *)local_145);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  iVar5 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
          ::begin((raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
                   *)local_40);
  __end1.field_1 = (anon_union_8_1_a8a14541_for_iterator_1)iVar5.ctrl_;
  iVar5 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
          ::end((raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
                 *)local_40);
  while( true ) {
    __end1.ctrl_ = (ctrl_t *)iVar5.field_1;
    p = (Person *)iVar5.ctrl_;
    bVar2 = phmap::priv::operator!=((iterator *)&__end1.field_1,(iterator *)&p);
    if (!bVar2) break;
    pPVar3 = phmap::priv::
             raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
             ::iterator::operator*((iterator *)&__end1.field_1);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)pPVar3);
    poVar4 = std::operator<<(poVar4,' ');
    poVar4 = std::operator<<(poVar4,(string *)&pPVar3->_last);
    poVar4 = std::operator<<(poVar4," (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,pPVar3->_age);
    poVar4 = std::operator<<(poVar4,")");
    std::operator<<(poVar4,'\n');
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
    ::iterator::operator++((iterator *)&__end1.field_1);
    iVar5.field_1.slot_ = (slot_type *)__end1.ctrl_;
    iVar5.ctrl_ = (ctrl_t *)p;
  }
  phmap::flat_hash_set<Person,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
  ::~flat_hash_set((flat_hash_set<Person,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
                    *)local_40);
  return persons.
         super_raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
         .settings_.
         super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
         .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._4_4_;
}

Assistant:

int main()
{
    // As we have defined a specialization of std::hash() for Person,
    // we can now create sparse_hash_set or sparse_hash_map of Persons
    // ----------------------------------------------------------------
    phmap::flat_hash_set<Person> persons = 
        { { "John", "Mitchell", 35 },
          { "Jane", "Smith",    32 },
          { "Jane", "Smith",    30 },
        };

    for (auto& p: persons)
        std::cout << p._first << ' ' << p._last << " (" << p._age << ")" << '\n';

}